

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.h
# Opt level: O2

cbtScalar __thiscall
cbtCollisionWorld::ClosestRayResultCallback::addSingleResult
          (ClosestRayResultCallback *this,LocalRayResult *rayResult,bool normalInWorldSpace)

{
  cbtCollisionObject *pcVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined7 in_register_00000011;
  undefined1 auVar5 [56];
  undefined1 auVar4 [64];
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar6;
  
  auVar5 = (undefined1  [56])0x0;
  (this->super_RayResultCallback).m_closestHitFraction = rayResult->m_hitFraction;
  pcVar1 = rayResult->m_collisionObject;
  (this->super_RayResultCallback).m_collisionObject = pcVar1;
  if ((int)CONCAT71(in_register_00000011,normalInWorldSpace) == 0) {
    cVar6 = ::operator*(&(pcVar1->m_worldTransform).m_basis,&rayResult->m_hitNormalLocal);
    auVar4._0_8_ = cVar6.m_floats._0_8_;
    auVar4._8_56_ = auVar5;
    auVar2._8_8_ = in_XMM1_Qb;
    auVar2._0_8_ = cVar6.m_floats._8_8_;
    auVar2 = vmovlhps_avx(auVar4._0_16_,auVar2);
    *(undefined1 (*) [16])(this->m_hitNormalWorld).m_floats = auVar2;
  }
  else {
    uVar3 = *(undefined8 *)((rayResult->m_hitNormalLocal).m_floats + 2);
    *(undefined8 *)(this->m_hitNormalWorld).m_floats =
         *(undefined8 *)(rayResult->m_hitNormalLocal).m_floats;
    *(undefined8 *)((this->m_hitNormalWorld).m_floats + 2) = uVar3;
  }
  cbtVector3::setInterpolate3
            (&this->m_hitPointWorld,(cbtVector3 *)&(this->super_RayResultCallback).field_0x24,
             &this->m_rayToWorld,rayResult->m_hitFraction);
  return rayResult->m_hitFraction;
}

Assistant:

virtual cbtScalar addSingleResult(LocalRayResult& rayResult, bool normalInWorldSpace)
		{
			//caller already does the filter on the m_closestHitFraction
			cbtAssert(rayResult.m_hitFraction <= m_closestHitFraction);

			m_closestHitFraction = rayResult.m_hitFraction;
			m_collisionObject = rayResult.m_collisionObject;
			if (normalInWorldSpace)
			{
				m_hitNormalWorld = rayResult.m_hitNormalLocal;
			}
			else
			{
				///need to transform normal into worldspace
				m_hitNormalWorld = m_collisionObject->getWorldTransform().getBasis() * rayResult.m_hitNormalLocal;
			}
			m_hitPointWorld.setInterpolate3(m_rayFromWorld, m_rayToWorld, rayResult.m_hitFraction);
			return rayResult.m_hitFraction;
		}